

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGXMLScanner2.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::IGXMLScanner::parseSchemaLocation
          (IGXMLScanner *this,XMLCh *schemaLocationStr,bool ignoreLoadSchema)

{
  XMLCh *loc;
  char16_t **ppcVar1;
  XMLCh *uri;
  XMLCh *local_90;
  XMLSize_t i;
  XMLBuffer normalBuf;
  XMLSize_t size;
  undefined1 local_38 [8];
  ArrayJanitor<char16_t> janLoc;
  XMLCh *locStr;
  bool ignoreLoadSchema_local;
  XMLCh *schemaLocationStr_local;
  IGXMLScanner *this_local;
  
  janLoc.fMemoryManager =
       (MemoryManager *)
       XMLString::replicate(schemaLocationStr,(this->super_XMLScanner).fMemoryManager);
  ArrayJanitor<char16_t>::ArrayJanitor
            ((ArrayJanitor<char16_t> *)local_38,(char16_t *)janLoc.fMemoryManager,
             (this->super_XMLScanner).fMemoryManager);
  processSchemaLocation(this,(XMLCh *)janLoc.fMemoryManager);
  normalBuf.fBuffer = (XMLCh *)ValueVectorOf<char16_t_*>::size(this->fLocationPairs);
  if (((ulong)normalBuf.fBuffer & 1) == 0) {
    XMLBuffer::XMLBuffer((XMLBuffer *)&i,0x3ff,(this->super_XMLScanner).fMemoryManager);
    for (local_90 = (XMLCh *)0x0; local_90 < normalBuf.fBuffer; local_90 = local_90 + 1) {
      ppcVar1 = ValueVectorOf<char16_t_*>::elementAt(this->fLocationPairs,(XMLSize_t)local_90);
      normalizeAttRawValue
                (this,(XMLCh *)SchemaSymbols::fgXSI_SCHEMALOCATION,*ppcVar1,(XMLBuffer *)&i);
      ppcVar1 = ValueVectorOf<char16_t_*>::elementAt(this->fLocationPairs,(long)local_90 + 1);
      loc = *ppcVar1;
      uri = XMLBuffer::getRawBuffer((XMLBuffer *)&i);
      resolveSchemaGrammar(this,loc,uri,ignoreLoadSchema);
    }
    XMLBuffer::~XMLBuffer((XMLBuffer *)&i);
  }
  else {
    XMLScanner::emitError(&this->super_XMLScanner,BadSchemaLocation);
  }
  ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)local_38);
  return;
}

Assistant:

void IGXMLScanner::parseSchemaLocation(const XMLCh* const schemaLocationStr, bool ignoreLoadSchema)
{
    XMLCh* locStr = XMLString::replicate(schemaLocationStr, fMemoryManager);
    ArrayJanitor<XMLCh> janLoc(locStr, fMemoryManager);

    processSchemaLocation(locStr);
    XMLSize_t size = fLocationPairs->size();

    if (size % 2 != 0 ) {
        emitError(XMLErrs::BadSchemaLocation);
    } else {
        // We need a buffer to normalize the attribute value into
        XMLBuffer normalBuf(1023, fMemoryManager);
        for(XMLSize_t i=0; i<size; i=i+2) {
            normalizeAttRawValue(SchemaSymbols::fgXSI_SCHEMALOCATION, fLocationPairs->elementAt(i), normalBuf);
            resolveSchemaGrammar(fLocationPairs->elementAt(i+1), normalBuf.getRawBuffer(), ignoreLoadSchema);
        }
    }
}